

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwnsc.cpp
# Opt level: O0

string * GetNwnInstallPath_abi_cxx11_(int CompilerVersion,bool Quiet)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  undefined8 uVar4;
  streambuf *psVar5;
  mapped_type *ppJVar6;
  vector<JSONValue_*,_std::allocator<JSONValue_*>_> *__x;
  size_type sVar7;
  pointer ppVar8;
  undefined8 uVar9;
  byte in_DL;
  int in_ESI;
  string *in_RDI;
  string SteamRootDir;
  iterator it;
  string GameStr;
  JSONArray array;
  JSONObject root;
  JSONValue *value;
  string str;
  stringstream buffer;
  ifstream InStream;
  string settingsFile;
  string KeyFile;
  char *EnvNwnRoot;
  string RootDir;
  undefined4 uVar10;
  DispatchAction in_stack_fffffffffffff79c;
  Writer *in_stack_fffffffffffff7a0;
  allocator *paVar11;
  undefined7 in_stack_fffffffffffff7a8;
  undefined1 in_stack_fffffffffffff7af;
  vector<JSONValue_*,_std::allocator<JSONValue_*>_> *in_stack_fffffffffffff7b0;
  string *psVar12;
  undefined8 in_stack_fffffffffffff7b8;
  Level level;
  Writer *in_stack_fffffffffffff7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7c8;
  VerboseLevel verboseLevel;
  undefined8 in_stack_fffffffffffff7d0;
  undefined7 in_stack_fffffffffffff7d8;
  undefined1 in_stack_fffffffffffff7df;
  map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
  *in_stack_fffffffffffff7e0;
  bool local_7e9;
  allocator local_781;
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [64];
  string local_680 [32];
  string local_660 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_640;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_638;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_630;
  string local_628 [32];
  wstring local_608 [32];
  string local_5e8 [39];
  allocator local_5c1;
  wstring local_5c0 [32];
  vector<JSONValue_*,_std::allocator<JSONValue_*>_> local_5a0;
  byte local_583;
  byte local_582;
  allocator local_581;
  wstring local_580 [32];
  _Self local_560;
  allocator local_551;
  wstring local_550 [32];
  _Self local_530 [7];
  JSONValue *local_4f8;
  string local_4f0 [32];
  stringstream local_4d0 [16];
  undefined1 local_4c0 [376];
  undefined1 local_348 [520];
  Writer local_140;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  undefined4 local_68;
  string local_58 [32];
  char *local_38;
  string local_30 [35];
  byte local_d;
  int local_c;
  
  local_d = in_DL & 1;
  local_c = in_ESI;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_58);
  local_38 = getenv("NWN_ROOT");
  if (local_38 == (char *)0x0) {
    if (local_c < 0xae) {
      paVar11 = &local_781;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,"",paVar11);
      std::allocator<char>::~allocator((allocator<char> *)&local_781);
      local_68 = 1;
    }
    else {
      std::__cxx11::string::string(local_88);
      GetHomeDirectory_abi_cxx11_();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7af,in_stack_fffffffffffff7a8),
                     (char *)in_stack_fffffffffffff7a0);
      psVar12 = local_a8;
      std::__cxx11::string::operator=(local_88,psVar12);
      std::__cxx11::string::~string(psVar12);
      std::__cxx11::string::~string(local_c8);
      uVar10 = 0;
      el::base::Writer::Writer
                (in_stack_fffffffffffff7c0,(Level)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 (char *)in_stack_fffffffffffff7b0,
                 CONCAT17(in_stack_fffffffffffff7af,in_stack_fffffffffffff7a8),
                 (char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,
                 (VerboseLevel)in_stack_fffffffffffff7d0);
      el::base::Writer::construct(&local_140,1,el::base::consts::kDefaultLoggerId);
      el::base::Writer::operator<<
                (in_stack_fffffffffffff7a0,(char (*) [15])CONCAT44(in_stack_fffffffffffff79c,uVar10)
                );
      el::base::Writer::operator<<
                (in_stack_fffffffffffff7a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff79c,uVar10));
      el::base::Writer::~Writer(in_stack_fffffffffffff7a0);
      bVar1 = FileExists((string *)0x1c3e46);
      if (bVar1) {
        std::ifstream::ifstream(local_348,local_88,_S_in);
        std::__cxx11::stringstream::stringstream(local_4d0);
        psVar5 = (streambuf *)std::ifstream::rdbuf();
        std::ostream::operator<<(local_4c0,psVar5);
        std::__cxx11::stringstream::str();
        std::__cxx11::string::c_str();
        local_4f8 = JSON::Parse((char *)CONCAT17(in_stack_fffffffffffff7af,in_stack_fffffffffffff7a8
                                                ));
        if (local_4f8 != (JSONValue *)0x0) {
          std::
          map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
          ::map((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                 *)0x1c3f1a);
          bVar1 = JSONValue::IsObject(local_4f8);
          if (bVar1) {
            JSONValue::AsObject_abi_cxx11_(local_4f8);
            std::
            map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
            ::operator=((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                         *)in_stack_fffffffffffff7a0,
                        (map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                         *)CONCAT44(in_stack_fffffffffffff79c,uVar10));
            std::allocator<wchar_t>::allocator();
            local_582 = 0;
            local_583 = 0;
            std::__cxx11::wstring::wstring(local_550,L"folders",&local_551);
            local_530[0]._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                 ::find((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                         *)CONCAT44(in_stack_fffffffffffff79c,uVar10),(key_type *)0x1c3fcb);
            local_560._M_node =
                 (_Base_ptr)
                 std::
                 map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                 ::end((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffff79c,uVar10));
            bVar1 = std::operator!=(local_530,&local_560);
            local_7e9 = false;
            if (bVar1) {
              std::allocator<wchar_t>::allocator();
              local_582 = 1;
              std::__cxx11::wstring::wstring(local_580,L"folders",&local_581);
              local_583 = 1;
              ppJVar6 = std::
                        map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                        ::operator[](in_stack_fffffffffffff7e0,
                                     (key_type *)
                                     CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8));
              local_7e9 = JSONValue::IsArray(*ppJVar6);
            }
            if ((local_583 & 1) != 0) {
              std::__cxx11::wstring::~wstring(local_580);
            }
            if ((local_582 & 1) != 0) {
              std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_581);
            }
            std::__cxx11::wstring::~wstring(local_550);
            std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_551);
            if (local_7e9 != false) {
              paVar11 = &local_5c1;
              std::allocator<wchar_t>::allocator();
              std::__cxx11::wstring::wstring(local_5c0,L"folders",paVar11);
              __x = (vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)
                    std::
                    map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                    ::operator[](in_stack_fffffffffffff7e0,
                                 (key_type *)
                                 CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8));
              JSONValue::AsArray((JSONValue *)
                                 (__x->super__Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start);
              std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::vector
                        ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)paVar11,__x);
              std::__cxx11::wstring::~wstring(local_5c0);
              std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_5c1);
              sVar7 = std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::size(&local_5a0);
              if (sVar7 != 0) {
                std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::operator[](&local_5a0,0);
                JSONValue::AsString_abi_cxx11_
                          ((JSONValue *)CONCAT44(in_stack_fffffffffffff79c,uVar10));
                ws2s((wstring *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8));
                std::__cxx11::string::operator=(local_30,local_5e8);
                std::__cxx11::string::~string(local_5e8);
                std::__cxx11::wstring::~wstring(local_608);
              }
              std::__cxx11::string::push_back((char)local_30);
              std::__cxx11::string::string(local_628);
              __gnu_cxx::
              __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::__normal_iterator(&local_630);
              local_638 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)std::
                             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffff79c,uVar10));
              local_630._M_current = local_638;
              while( true ) {
                local_640 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)std::
                               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffff79c,uVar10));
                bVar1 = __gnu_cxx::operator!=
                                  ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    *)in_stack_fffffffffffff7a0,
                                   (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    *)CONCAT44(in_stack_fffffffffffff79c,uVar10));
                level = (Level)((ulong)in_stack_fffffffffffff7b8 >> 0x20);
                verboseLevel = (VerboseLevel)in_stack_fffffffffffff7d0;
                if (!bVar1) break;
                __gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator->(&local_630);
                std::operator+(in_stack_fffffffffffff7c8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff7c0);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff7af,in_stack_fffffffffffff7a8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff7a0);
                bVar2 = FileExists((string *)0x1c44db);
                std::__cxx11::string::~string(local_660);
                std::__cxx11::string::~string(local_680);
                level = (Level)((ulong)in_stack_fffffffffffff7b8 >> 0x20);
                verboseLevel = (VerboseLevel)in_stack_fffffffffffff7d0;
                if ((bVar2 & 1) != 0) {
                  ppVar8 = __gnu_cxx::
                           __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ::operator->(&local_630);
                  std::__cxx11::string::operator+=(local_30,(string *)ppVar8);
                  std::__cxx11::string::push_back((char)local_30);
                  ppVar8 = __gnu_cxx::
                           __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ::operator->(&local_630);
                  std::__cxx11::string::operator=(local_628,(string *)&ppVar8->second);
                  break;
                }
                __gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator++((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)CONCAT17(in_stack_fffffffffffff7af,in_stack_fffffffffffff7a8),
                             (int)((ulong)in_stack_fffffffffffff7a0 >> 0x20));
              }
              uVar10 = 0;
              el::base::Writer::Writer
                        (in_stack_fffffffffffff7c0,level,(char *)in_stack_fffffffffffff7b0,
                         CONCAT17(in_stack_fffffffffffff7af,in_stack_fffffffffffff7a8),
                         (char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff79c,verboseLevel);
              el::base::Writer::construct
                        ((Writer *)(local_720 + 0x20),1,el::base::consts::kDefaultLoggerId);
              el::base::Writer::operator<<
                        (in_stack_fffffffffffff7a0,
                         (char (*) [10])CONCAT44(in_stack_fffffffffffff79c,uVar10));
              el::base::Writer::operator<<
                        (in_stack_fffffffffffff7a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff79c,uVar10));
              el::base::Writer::~Writer(in_stack_fffffffffffff7a0);
              if ((local_d & 1) == 0) {
                uVar4 = std::__cxx11::string::c_str();
                uVar9 = std::__cxx11::string::c_str();
                PrintfTextOut::WriteText(&g_TextOut,"Base game %s location - %s\n",uVar4,uVar9);
              }
              std::__cxx11::string::~string(local_628);
              std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::~vector
                        (in_stack_fffffffffffff7b0);
            }
          }
          std::
          map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
          ::~map((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                  *)0x1c4700);
        }
        std::__cxx11::string::~string(local_4f0);
        std::__cxx11::stringstream::~stringstream(local_4d0);
        std::ifstream::~ifstream(local_348);
      }
      else {
        std::__cxx11::string::string(local_720);
        GetHomeDirectory_abi_cxx11_();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff7af,in_stack_fffffffffffff7a8),
                       (char *)in_stack_fffffffffffff7a0);
        psVar12 = local_740;
        std::__cxx11::string::operator=(local_720,psVar12);
        std::__cxx11::string::~string(psVar12);
        std::__cxx11::string::~string(local_760);
        std::operator+(in_stack_fffffffffffff7c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff7c0);
        bVar2 = FileExists((string *)0x1c4802);
        std::__cxx11::string::~string(local_780);
        if ((bVar2 & 1) != 0) {
          std::__cxx11::string::operator=(local_30,local_720);
        }
        std::__cxx11::string::~string(local_720);
      }
      std::__cxx11::string::string(in_RDI,local_30);
      local_68 = 1;
      std::__cxx11::string::~string(local_88);
    }
  }
  else {
    std::__cxx11::string::operator=(local_30,local_38);
    pcVar3 = (char *)std::__cxx11::string::back();
    if (*pcVar3 != '/') {
      std::__cxx11::string::push_back((char)local_30);
    }
    std::__cxx11::string::operator=(local_58,"/data/nwn_base.key");
    if ((local_d & 1) == 0) {
      uVar4 = std::__cxx11::string::c_str();
      PrintfTextOut::WriteText(&g_TextOut,"Base game location from NWN_ROOT - %s\n",uVar4);
    }
    std::__cxx11::string::string(in_RDI,local_30);
    local_68 = 1;
  }
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string
GetNwnInstallPath(int CompilerVersion, bool Quiet)
/*++

Routine Description:

	This routine attempts to auto detect the NWN1 installation path from the
	registry.

Arguments:

	None.

Return Value:

	The routine returns the game installation path if successful.  Otherwise,
	an std::exception is raised.

Environment:

	User mode.

--*/
{
    std::string RootDir;
    char *EnvNwnRoot;
    std::string KeyFile;

    EnvNwnRoot = getenv("NWN_ROOT");

    if (EnvNwnRoot != NULL) {
        RootDir = EnvNwnRoot;
#if defined(_WINDOWS)
        if (RootDir.back() != '\\')
            RootDir.push_back( '\\' );
        KeyFile = "\\data\\nwn_base.key";
#else
        if (RootDir.back() != '/')
            RootDir.push_back('/');
        KeyFile = "/data/nwn_base.key";
#endif
        if (!Quiet) {
            g_TextOut.WriteText("Base game location from NWN_ROOT - %s\n", RootDir.c_str());
        }
        return RootDir;
    } else {
        if (CompilerVersion >= 174) {

            std::string settingsFile;

#if defined(__APPLE__)
            settingsFile = GetHomeDirectory() + "/Library/Application Support/Beamdog Client/settings.json";
#elif defined(__linux__)
            settingsFile = GetHomeDirectory() + "/.config/Beamdog Client/settings.json";
#elif defined(_WINDOWS)
			settingsFile = GetHomeDirectory() + "\\Beamdog Client\\settings.json";
#endif
            LOG(DEBUG) << " settingsFile " << settingsFile;

            if (FileExists(settingsFile)) {
                std::ifstream InStream(settingsFile, std::ifstream::in);
                std::stringstream buffer;
                buffer << InStream.rdbuf();

                std::string str(buffer.str());

                // Parse data
                JSONValue *value = JSON::Parse(str.c_str());

                if (value != NULL) {

                    JSONObject root;
                    if (value->IsObject() != false) {
                        root = value->AsObject();

                        // Retrieving an array
                        if (root.find(L"folders") != root.end() && root[L"folders"]->IsArray()) {
                            JSONArray array = root[L"folders"]->AsArray();

                            if (array.size() > 0) {
                                RootDir = ws2s(array[0]->AsString());
                            }

#ifdef _WINDOWS
                            RootDir.push_back('\\');
#else
                            RootDir.push_back('/');
#endif

                            std::string GameStr;

                            std::vector<std::pair<std::string, std::string>>::iterator it;  // declare an iterator to a vector of strings
                            for (it = NwnVersions.begin(); it != NwnVersions.end(); it++) {
                                if (FileExists(RootDir + it->first + KeyFile)) {
                                    RootDir += it->first;
#ifdef _WINDOWS
                                    RootDir.push_back('\\');
#else
                                    RootDir.push_back('/');
#endif
                                    GameStr = it->second;
                                    break;
                                }
                            }

                            LOG(DEBUG) << " RootDir " << RootDir;
                            if (!Quiet) {
                                g_TextOut.WriteText("Base game %s location - %s\n", GameStr.c_str(), RootDir.c_str());
                            }
                        }

                    }
                }
            } else {
                std::string SteamRootDir;
#if defined(__APPLE__)
                SteamRootDir = GetHomeDirectory() + "/Library/Application Support/Steam/steamapps/common/Neverwinter Nights/";
#elif defined(__linux__)
                SteamRootDir = GetHomeDirectory() + "/.local/share/Steam/steamapps/common/Neverwinter Nights/";
#elif defined(_WINDOWS)
                SteamRootDir = "C:\\Program Files (x86)\\Steam\\steamapps\\common\\Neverwinter Nights\\";
#endif
                if (FileExists(SteamRootDir + KeyFile))
                    RootDir = SteamRootDir;
            }
            return RootDir;

        } else {
#if defined(_WINDOWS)
            HKEY Key;
            LONG Status;

            Status = RegOpenKeyEx(
                HKEY_LOCAL_MACHINE,
                "SOFTWARE\\BioWare\\NWN\\Neverwinter",
                REG_OPTION_RESERVED,
#ifdef _WIN64
                KEY_QUERY_VALUE | KEY_WOW64_32KEY,
#else
                KEY_QUERY_VALUE,
#endif
                &Key);

            if (Status != NO_ERROR)
                throw std::runtime_error( "Unable to open NWN registry key" );

            try
            {
                    CHAR                NameBuffer[ MAX_PATH + 1 ];
                    DWORD               NameBufferSize;
                    bool                FoundIt;
                    static const char * ValueNames[ ] =
                    {
                        "Path",     // Retail NWN
                        "Location", // Steam NWN
                    };

                    FoundIt = false;

                    for (size_t i = 0; i < _countof( ValueNames ); i += 1)
                    {
                        NameBufferSize = sizeof( NameBuffer ) - sizeof( NameBuffer[ 0 ] );

                        Status = RegQueryValueExA(
                            Key,
                            ValueNames[ i ],
                            nullptr,
                            nullptr,
                            (LPBYTE) NameBuffer,
                            &NameBufferSize);

                        if (Status != NO_ERROR)
                            continue;

                        //
                        // Strip trailing nullptr byte if it exists.
                        //

                        if ((NameBufferSize > 0) &&
                            (NameBuffer[ NameBufferSize - 1 ] == '\0'))
                            NameBufferSize -= 1;

                        std::string NwnRootDir = std::string( NameBuffer, NameBufferSize );

                        if (!Quiet) {
                            g_TextOut.WriteText("Base game location - %s\n", NwnRootDir.c_str());
                        }

                        return NwnRootDir;
                    }

                    throw std::exception( "Unable to read Path from NWN registry key" );
            }
            catch (...)
            {
                RegCloseKey( Key );
                throw;
            }
#else
            return "";
#endif
        }
    }
}